

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::ConstructSourceFileFlags(cmGeneratorTarget *this)

{
  pointer pbVar1;
  int iVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  string *relFile;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relFiles;
  cmSourceFile *sf;
  allocator<char> local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  if (this->SourceFileFlagsConstructed == false) {
    this->SourceFileFlagsConstructed = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"PUBLIC_HEADER",(allocator<char> *)&local_68);
    pcVar3 = GetProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pcVar3 != (char *)0x0) {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar3,&local_69);
      cmSystemTools::ExpandListArgument(&local_50,&local_68,false);
      std::__cxx11::string::~string((string *)&local_50);
      pbVar1 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        local_50._M_dataplus._M_p = (pointer)cmMakefile::GetSource(this->Makefile,pbVar5,Ambiguous);
        if ((cmSourceFile *)local_50._M_dataplus._M_p != (cmSourceFile *)0x0) {
          pmVar4 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,(key_type *)&local_50);
          pmVar4->MacFolder = "Headers";
          pmVar4->Type = SourceFileTypePublicHeader;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"PRIVATE_HEADER",(allocator<char> *)&local_68);
    pcVar3 = GetProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pcVar3 != (char *)0x0) {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar3,&local_69);
      cmSystemTools::ExpandListArgument(&local_50,&local_68,false);
      std::__cxx11::string::~string((string *)&local_50);
      pbVar1 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        local_50._M_dataplus._M_p = (pointer)cmMakefile::GetSource(this->Makefile,pbVar5,Ambiguous);
        if ((cmSourceFile *)local_50._M_dataplus._M_p != (cmSourceFile *)0x0) {
          pmVar4 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,(key_type *)&local_50);
          pmVar4->MacFolder = "PrivateHeaders";
          pmVar4->Type = SourceFileTypePrivateHeader;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"RESOURCE",(allocator<char> *)&local_68);
    pcVar3 = GetProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pcVar3 != (char *)0x0) {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar3,&local_69);
      cmSystemTools::ExpandListArgument(&local_50,&local_68,false);
      std::__cxx11::string::~string((string *)&local_50);
      pbVar1 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        local_50._M_dataplus._M_p = (pointer)cmMakefile::GetSource(this->Makefile,pbVar5,Ambiguous);
        if ((cmSourceFile *)local_50._M_dataplus._M_p != (cmSourceFile *)0x0) {
          pmVar4 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,(key_type *)&local_50);
          pmVar4->MacFolder = "";
          iVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])
                            (this->GlobalGenerator,this->Makefile);
          if ((char)iVar2 == '\0') {
            pmVar4->MacFolder = "Resources";
          }
          pmVar4->Type = SourceFileTypeResource;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::ConstructSourceFileFlags() const
{
  if (this->SourceFileFlagsConstructed) {
    return;
  }
  this->SourceFileFlagsConstructed = true;

  // Process public headers to mark the source files.
  if (const char* files = this->GetProperty("PUBLIC_HEADER")) {
    std::vector<std::string> relFiles;
    cmSystemTools::ExpandListArgument(files, relFiles);
    for (std::string const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "Headers";
        flags.Type = cmGeneratorTarget::SourceFileTypePublicHeader;
      }
    }
  }

  // Process private headers after public headers so that they take
  // precedence if a file is listed in both.
  if (const char* files = this->GetProperty("PRIVATE_HEADER")) {
    std::vector<std::string> relFiles;
    cmSystemTools::ExpandListArgument(files, relFiles);
    for (std::string const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "PrivateHeaders";
        flags.Type = cmGeneratorTarget::SourceFileTypePrivateHeader;
      }
    }
  }

  // Mark sources listed as resources.
  if (const char* files = this->GetProperty("RESOURCE")) {
    std::vector<std::string> relFiles;
    cmSystemTools::ExpandListArgument(files, relFiles);
    for (std::string const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "";
        if (!this->GlobalGenerator->ShouldStripResourcePath(this->Makefile)) {
          flags.MacFolder = "Resources";
        }
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
      }
    }
  }
}